

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ir.c
# Opt level: O3

TRef lj_ir_emit(jit_State *J)

{
  uint uVar1;
  int iVar2;
  IRIns *pIVar3;
  byte bVar4;
  ulong uVar5;
  
  uVar1 = (J->cur).nins;
  uVar5 = (ulong)uVar1;
  if (J->irtoplim <= uVar1) {
    lj_ir_growtop(J);
  }
  (J->cur).nins = uVar1 + 1;
  pIVar3 = (J->cur).ir;
  bVar4 = (J->fold).ins.field_1.o;
  *(IRRef1 *)((long)pIVar3 + uVar5 * 8 + 6) = J->chain[bVar4];
  J->chain[bVar4] = (IRRef1)uVar1;
  *(byte *)((long)pIVar3 + uVar5 * 8 + 5) = bVar4;
  pIVar3[uVar5].field_0.op1 = (J->fold).ins.field_0.op1;
  *(IRRef1 *)((long)pIVar3 + uVar5 * 8 + 2) = (J->fold).ins.field_0.op2;
  iVar2 = *(int *)((long)&(J->fold).ins + 4);
  bVar4 = (byte)iVar2;
  (J->guardemit).irt = (J->guardemit).irt | bVar4;
  *(byte *)((long)pIVar3 + uVar5 * 8 + 4) = bVar4;
  return iVar2 * 0x1000000 + uVar1;
}

Assistant:

TRef LJ_FASTCALL lj_ir_emit(jit_State *J)
{
  IRRef ref = lj_ir_nextins(J);
  IRIns *ir = IR(ref);
  IROp op = fins->o;
  ir->prev = J->chain[op];
  J->chain[op] = (IRRef1)ref;
  ir->o = op;
  ir->op1 = fins->op1;
  ir->op2 = fins->op2;
  J->guardemit.irt |= fins->t.irt;
  return TREF(ref, irt_t((ir->t = fins->t)));
}